

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O0

void __thiscall
icu_63::NumberFormat::getEffectiveCurrency(NumberFormat *this,UChar *result,UErrorCode *ec)

{
  char16_t *src;
  char *local_30;
  char *loc;
  UChar *c;
  UErrorCode *ec_local;
  UChar *result_local;
  NumberFormat *this_local;
  
  src = getCurrency(this);
  if (*src == L'\0') {
    local_30 = Format::getLocaleID(&this->super_Format,ULOC_VALID_LOCALE,ec);
    if (local_30 == (char *)0x0) {
      local_30 = uloc_getDefault_63();
    }
    ucurr_forLocale_63(local_30,result,4,ec);
  }
  else {
    u_strncpy_63(result,src,3);
    result[3] = L'\0';
  }
  return;
}

Assistant:

void NumberFormat::getEffectiveCurrency(UChar* result, UErrorCode& ec) const {
    const UChar* c = getCurrency();
    if (*c != 0) {
        u_strncpy(result, c, 3);
        result[3] = 0;
    } else {
        const char* loc = getLocaleID(ULOC_VALID_LOCALE, ec);
        if (loc == NULL) {
            loc = uloc_getDefault();
        }
        ucurr_forLocale(loc, result, 4, &ec);
    }
}